

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QModelIndexList * __thiscall
QAbstractItemView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QAbstractItemView *this)

{
  long lVar1;
  quintptr qVar2;
  int iVar3;
  bool bVar4;
  char cVar5;
  iterator aend;
  iterator iVar6;
  long lVar7;
  QModelIndex *pQVar8;
  QModelIndex *pQVar9;
  long lVar10;
  const_iterator abegin;
  QModelIndex *pQVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 800));
  if (!bVar4) goto LAB_004e5f2e;
  QItemSelectionModel::selectedIndexes();
  QArrayDataPointer<QModelIndex>::operator=(&__return_storage_ptr__->d,&local_50);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_50);
  pQVar9 = (__return_storage_ptr__->d).ptr;
  lVar1 = (__return_storage_ptr__->d).size;
  lVar10 = lVar1 * 0x18;
  pQVar11 = pQVar9;
  for (lVar7 = lVar1 >> 2; pQVar8 = pQVar11, 0 < lVar7; lVar7 = lVar7 + -1) {
    cVar5 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar11);
    if (cVar5 != '\0') goto LAB_004e5eb9;
    cVar5 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar11 + 1);
    pQVar8 = pQVar11 + 1;
    if (cVar5 != '\0') goto LAB_004e5eb9;
    cVar5 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar11 + 2);
    pQVar8 = pQVar11 + 2;
    if (cVar5 != '\0') goto LAB_004e5eb9;
    cVar5 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar11 + 3);
    pQVar8 = pQVar11 + 3;
    if (cVar5 != '\0') goto LAB_004e5eb9;
    pQVar11 = pQVar11 + 4;
    lVar10 = lVar10 + -0x60;
  }
  lVar7 = lVar10 / 0x18;
  if (lVar7 == 1) {
LAB_004e5f64:
    cVar5 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar11);
    pQVar8 = pQVar9 + lVar1;
    if (cVar5 != '\0') {
      pQVar8 = pQVar11;
    }
  }
  else if (lVar7 == 2) {
LAB_004e5e96:
    cVar5 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar8);
    if (cVar5 == '\0') {
      pQVar11 = pQVar8 + 1;
      goto LAB_004e5f64;
    }
  }
  else {
    pQVar8 = pQVar9 + lVar1;
    if ((lVar7 == 3) &&
       (cVar5 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar11,lVar10 % 0x18), pQVar8 = pQVar11,
       cVar5 == '\0')) {
      pQVar8 = pQVar11 + 1;
      goto LAB_004e5e96;
    }
  }
LAB_004e5eb9:
  if (((long)pQVar8 - (long)pQVar9) / 0x18 != (__return_storage_ptr__->d).size) {
    aend = QList<QModelIndex>::end(__return_storage_ptr__);
    iVar6 = QList<QModelIndex>::begin(__return_storage_ptr__);
    abegin.i = iVar6.i + ((long)pQVar8 - (long)pQVar9);
    pQVar9 = abegin.i;
    while (pQVar11 = pQVar9, pQVar9 = pQVar11 + 1, pQVar9 != aend.i) {
      cVar5 = (**(code **)(*(long *)this + 0x2c0))(this,pQVar9);
      if (cVar5 == '\0') {
        ((abegin.i)->m).ptr = pQVar11[1].m.ptr;
        iVar3 = pQVar9->c;
        qVar2 = pQVar11[1].i;
        (abegin.i)->r = pQVar9->r;
        (abegin.i)->c = iVar3;
        (abegin.i)->i = qVar2;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QModelIndex>::erase(__return_storage_ptr__,abegin,(const_iterator)aend.i);
  }
LAB_004e5f2e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QAbstractItemView::selectedIndexes() const
{
    Q_D(const QAbstractItemView);
    QModelIndexList indexes;
    if (d->selectionModel) {
        indexes = d->selectionModel->selectedIndexes();
        auto isHidden = [this](const QModelIndex &idx) {
            return isIndexHidden(idx);
        };
        indexes.removeIf(isHidden);
    }
    return indexes;
}